

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::container_internal::slot_type<S2CellId,S2ShapeIndexCell*>::
     construct<std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,std::pair<S2CellId_const,S2ShapeIndexCell*>>
               (allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_> *alloc,
               slot_type<S2CellId,_S2ShapeIndexCell_*> *slot,
               pair<const_S2CellId,_S2ShapeIndexCell_*> *args)

{
  pair<const_S2CellId,_S2ShapeIndexCell_*> *args_local;
  slot_type<S2CellId,_S2ShapeIndexCell_*> *slot_local;
  allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_> *alloc_local;
  
  slot_type<S2CellId,_S2ShapeIndexCell_*>::emplace(slot);
  allocator_traits<std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>>::
  construct<std::pair<S2CellId,S2ShapeIndexCell*>,std::pair<S2CellId_const,S2ShapeIndexCell*>>
            (alloc,(pair<S2CellId,_S2ShapeIndexCell_*> *)&slot->value,args);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                   std::forward<Args>(args)...);
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::forward<Args>(args)...);
    }
  }